

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io-window.cc
# Opt level: O3

void __thiscall Debugger::IOWindow::Tick(IOWindow *this)

{
  Emulator *pEVar1;
  BitArg args;
  BitArg args_00;
  BitArg args_1;
  BitArg args_1_00;
  BitArg args_2;
  BitArg args_2_00;
  BitArg arg;
  BitArg arg_00;
  BitArg args_3;
  BitArg args_3_00;
  BitArg args_01;
  BitArg args_02;
  BitArg args_4;
  BitArg args_4_00;
  BitArg args_1_01;
  BitArg args_1_02;
  BitArg args_5;
  BitArg args_5_00;
  BitArg args_2_01;
  BitArg args_2_02;
  BitArg args_6;
  BitArg args_6_00;
  BitArg arg_01;
  BitArg arg_02;
  BitArg args_3_01;
  BitArg arg_03;
  BitArg args_03;
  BitArg args_04;
  BitArg args_3_02;
  BitArg args_7;
  undefined1 auVar2 [32];
  BitArg args_7_00;
  BitArg args_05;
  BitArg args_06;
  CgbSwatchArg args_2_03;
  CgbSwatchArg args_2_04;
  CgbSwatchArg args_2_05;
  CgbSwatchArg args_2_06;
  CgbSwatchArg args_2_07;
  CgbSwatchArg args_2_08;
  CgbSwatchArg args_2_09;
  CgbSwatchArg args_2_10;
  CgbSwatchArg args_2_11;
  CgbSwatchArg args_2_12;
  CgbSwatchArg args_2_13;
  CgbSwatchArg args_2_14;
  CgbSwatchArg args_2_15;
  CgbSwatchArg args_2_16;
  CgbSwatchArg args_2_17;
  CgbSwatchArg args_3_03;
  CgbSwatchArg args_3_04;
  CgbSwatchArg args_3_05;
  CgbSwatchArg args_3_06;
  CgbSwatchArg args_3_07;
  CgbSwatchArg args_3_08;
  CgbSwatchArg args_3_09;
  CgbSwatchArg args_3_10;
  CgbSwatchArg args_3_11;
  CgbSwatchArg args_3_12;
  CgbSwatchArg args_3_13;
  CgbSwatchArg args_3_14;
  CgbSwatchArg args_3_15;
  CgbSwatchArg args_3_16;
  CgbSwatchArg args_3_17;
  bool bVar3;
  byte bVar4;
  Debugger *pDVar5;
  u8 uVar6;
  undefined8 uVar7;
  char *pcVar8;
  char *pcVar9;
  IntArg args_07;
  IntArg args_08;
  IntArg args_09;
  IntArg args_1_03;
  IntArg args_1_04;
  CgbSwatchArg args_10;
  CgbSwatchArg args_11;
  CgbSwatchArg args_12;
  CgbSwatchArg args_1_05;
  CgbSwatchArg args_1_06;
  CgbSwatchArg args_1_07;
  CgbSwatchArg args_1_08;
  CgbSwatchArg args_1_09;
  CgbSwatchArg args_1_10;
  CgbSwatchArg args_1_11;
  CgbSwatchArg args_1_12;
  CgbSwatchArg args_1_13;
  CgbSwatchArg args_1_14;
  CgbSwatchArg args_1_15;
  CgbSwatchArg args_1_16;
  CgbSwatchArg args_1_17;
  CgbSwatchArg args_1_18;
  CgbSwatchArg args_1_19;
  undefined1 local_618 [8];
  undefined8 uStack_610;
  char *local_608;
  char *pcStack_600;
  undefined1 local_5f8;
  undefined7 uStack_5f7;
  char local_5f0;
  undefined7 uStack_5ef;
  char *pcStack_5e8;
  char *local_5e0;
  undefined8 uStack_5d8;
  undefined1 local_5d0;
  undefined7 uStack_5cf;
  undefined1 local_5c8;
  undefined7 uStack_5c7;
  char *pcStack_5c0;
  char *local_5b8;
  undefined8 uStack_5b0;
  undefined1 local_5a8;
  undefined7 uStack_5a7;
  SgbSwatchArg local_5a0;
  SgbSwatchArg local_598;
  SgbSwatchArg local_590;
  undefined8 local_588;
  undefined4 local_580;
  undefined8 local_578;
  undefined4 local_570;
  undefined8 local_568;
  undefined4 local_560;
  undefined8 local_558;
  undefined4 local_550;
  SgbSwatchArg local_548;
  undefined4 local_540;
  SgbSwatchArg local_538;
  undefined4 local_530;
  SgbSwatchArg local_528;
  undefined4 local_520;
  undefined8 local_518;
  undefined4 local_510;
  undefined8 local_508;
  undefined4 local_500;
  undefined8 local_4f8;
  undefined4 local_4f0;
  undefined8 local_4e8;
  undefined4 local_4e0;
  undefined8 local_4d8;
  undefined4 local_4d0;
  undefined8 local_4c8;
  undefined4 local_4c0;
  undefined8 local_4b8;
  undefined4 local_4b0;
  undefined8 local_4a8;
  undefined4 local_4a0;
  undefined8 local_498;
  undefined4 local_490;
  char buf [10];
  float fStack_47c;
  uint7 uStack_467;
  undefined1 local_458 [8];
  undefined8 uStack_450;
  char *local_448;
  undefined8 uStack_440;
  undefined1 local_438;
  undefined7 uStack_437;
  undefined8 local_428;
  undefined4 local_420;
  undefined8 local_418;
  undefined4 local_410;
  undefined8 local_408;
  undefined4 local_400;
  undefined8 local_3f8;
  undefined4 local_3f0;
  SgbSwatchArg local_3e8;
  undefined4 local_3e0;
  SgbSwatchArg local_3d8;
  undefined4 local_3d0;
  SgbSwatchArg local_3c8;
  undefined4 local_3c0;
  undefined8 local_3b8;
  undefined4 local_3b0;
  undefined8 local_3a8;
  undefined4 local_3a0;
  undefined8 local_398;
  undefined4 local_390;
  undefined8 local_388;
  undefined4 local_380;
  undefined8 local_378;
  undefined4 local_370;
  undefined8 local_368;
  undefined4 local_360;
  undefined8 local_358;
  undefined4 local_350;
  undefined8 local_348;
  undefined4 local_340;
  undefined8 local_338;
  undefined4 local_330;
  undefined1 local_328;
  undefined7 uStack_327;
  char *pcStack_320;
  char *local_318;
  char *pcStack_310;
  undefined1 local_308;
  uint7 uStack_307;
  undefined1 local_300;
  undefined7 uStack_2ff;
  char *pcStack_2f8;
  char *local_2f0;
  char *pcStack_2e8;
  undefined1 local_2e0;
  uint7 uStack_2df;
  undefined1 local_2d8;
  undefined7 uStack_2d7;
  char *pcStack_2d0;
  char *local_2c8;
  char *pcStack_2c0;
  undefined1 local_2b8;
  undefined7 uStack_2b7;
  undefined1 local_2b0;
  undefined7 uStack_2af;
  char *pcStack_2a8;
  char *local_2a0;
  char *pcStack_298;
  undefined1 local_290;
  uint7 uStack_28f;
  undefined1 local_288;
  undefined7 uStack_287;
  char *pcStack_280;
  char *local_278;
  char *pcStack_270;
  undefined1 local_268;
  uint7 uStack_267;
  undefined1 local_260;
  undefined7 uStack_25f;
  char *pcStack_258;
  char *local_250;
  char *pcStack_248;
  undefined1 local_240;
  uint7 uStack_23f;
  undefined1 local_238;
  undefined7 uStack_237;
  char *pcStack_230;
  char *local_228;
  char *pcStack_220;
  undefined1 local_218;
  uint7 uStack_217;
  undefined1 local_210;
  undefined7 uStack_20f;
  char *pcStack_208;
  char *local_200;
  char *pcStack_1f8;
  undefined1 local_1f0;
  uint7 uStack_1ef;
  undefined1 local_1e8;
  undefined7 uStack_1e7;
  char *pcStack_1e0;
  char *local_1d8;
  char *pcStack_1d0;
  undefined1 local_1c8;
  uint7 uStack_1c7;
  undefined1 local_1c0;
  undefined7 uStack_1bf;
  char *pcStack_1b8;
  char *local_1b0;
  char *pcStack_1a8;
  undefined1 local_1a0;
  uint7 uStack_19f;
  undefined1 local_198;
  undefined7 uStack_197;
  char *pcStack_190;
  char *local_188;
  undefined8 uStack_180;
  undefined1 local_178;
  undefined7 uStack_177;
  undefined1 local_170;
  undefined7 uStack_16f;
  char *pcStack_168;
  char *local_160;
  undefined8 uStack_158;
  undefined1 local_150;
  undefined7 uStack_14f;
  undefined1 local_148;
  undefined7 uStack_147;
  char *pcStack_140;
  char *local_138;
  undefined8 uStack_130;
  undefined1 local_128;
  undefined7 uStack_127;
  undefined1 local_120;
  undefined7 uStack_11f;
  char *pcStack_118;
  char *local_110;
  undefined8 uStack_108;
  undefined1 local_100;
  undefined7 uStack_ff;
  undefined1 local_f8;
  undefined7 uStack_f7;
  char *pcStack_f0;
  char *local_e8;
  undefined8 uStack_e0;
  undefined1 local_d8;
  undefined7 uStack_d7;
  undefined1 local_d0;
  undefined7 uStack_cf;
  char *pcStack_c8;
  char *local_c0;
  undefined8 uStack_b8;
  undefined1 local_b0;
  undefined7 uStack_af;
  undefined1 local_a8;
  undefined7 uStack_a7;
  char *pcStack_a0;
  char *local_98;
  undefined8 uStack_90;
  undefined1 local_88;
  undefined7 uStack_87;
  undefined1 local_80;
  undefined7 uStack_7f;
  char *pcStack_78;
  char *local_70;
  undefined8 uStack_68;
  undefined1 local_60;
  undefined7 uStack_5f;
  char local_52 [10];
  ImVec4 local_48;
  
  if ((this->super_Window).is_open == true) {
    bVar3 = ImGui::Begin("IO",&(this->super_Window).is_open,0);
    if (bVar3) {
      local_80 = 0x18;
      pcStack_78 = "D";
      local_70 = "_";
      uStack_68 = 0;
      local_60 = 1;
      local_a8 = 0x14;
      pcStack_a0 = "U";
      local_98 = "_";
      uStack_90 = 0;
      local_88 = 1;
      local_d0 = 0x12;
      pcStack_c8 = "L";
      local_c0 = "_";
      uStack_b8 = 0;
      local_b0 = 1;
      local_f8 = 0x11;
      pcStack_f0 = "R";
      local_e8 = "_";
      uStack_e0 = 0;
      local_d8 = 1;
      local_120 = 0x28;
      pcStack_118 = "+";
      local_110 = "_";
      uStack_108 = 0;
      local_100 = 1;
      local_148 = 0x24;
      pcStack_140 = "-";
      local_138 = "_";
      uStack_130 = 0;
      local_128 = 1;
      local_170 = 0x22;
      pcStack_168 = "B";
      local_160 = "_";
      uStack_158 = 0;
      local_150 = 1;
      local_198 = 0x21;
      pcStack_190 = "A";
      local_188 = "_";
      uStack_180 = 0;
      local_178 = 1;
      args_6._33_7_ = uStack_14f;
      args_6.invert = true;
      args_6._1_7_ = uStack_16f;
      args_6.mask = 0x22;
      args_5._33_7_ = uStack_127;
      args_5.invert = true;
      args_5._1_7_ = uStack_147;
      args_5.mask = 0x24;
      args_4._33_7_ = uStack_ff;
      args_4.invert = true;
      args_4._1_7_ = uStack_11f;
      args_4.mask = 0x28;
      args_3._33_7_ = uStack_d7;
      args_3.invert = true;
      args_3._1_7_ = uStack_f7;
      args_3.mask = 0x11;
      args_2._33_7_ = uStack_af;
      args_2.invert = true;
      args_2._1_7_ = uStack_cf;
      args_2.mask = 0x12;
      args_1._33_7_ = uStack_87;
      args_1.invert = true;
      args_1._1_7_ = uStack_a7;
      args_1.mask = 0x14;
      args._33_7_ = uStack_5f;
      args.invert = true;
      args._1_7_ = uStack_7f;
      args.mask = 0x18;
      args.true_text = "D";
      args.false_text = "_";
      args.tooltip = (char *)0x0;
      args_1.true_text = "U";
      args_1.false_text = "_";
      args_1.tooltip = (char *)0x0;
      args_2.true_text = "L";
      args_2.false_text = "_";
      args_2.tooltip = (char *)0x0;
      args_3.true_text = "R";
      args_3.false_text = "_";
      args_3.tooltip = (char *)0x0;
      args_4.true_text = "+";
      args_4.false_text = "_";
      args_4.tooltip = (char *)0x0;
      args_5.true_text = "-";
      args_5.false_text = "_";
      args_5.tooltip = (char *)0x0;
      args_6.true_text = "B";
      args_6.false_text = "_";
      args_6.tooltip = (char *)0x0;
      auVar2 = ZEXT2032(CONCAT416(0x1c643c,CONCAT88("A",CONCAT71(uStack_197,0x21))));
      args_7._32_4_ = (int)CONCAT71(uStack_177,1);
      args_7.mask = auVar2[0];
      args_7._1_7_ = auVar2._1_7_;
      args_7.true_text = (char *)auVar2._8_8_;
      args_7.false_text = (char *)auVar2._16_8_;
      args_7.tooltip = (char *)auVar2._24_8_;
      args_7._36_4_ = (int)((uint7)uStack_177 >> 0x18);
      (anonymous_namespace)::
      TextReg<(anonymous_namespace)::BitArg,(anonymous_namespace)::BitArg,(anonymous_namespace)::BitArg,(anonymous_namespace)::BitArg,(anonymous_namespace)::BitArg,(anonymous_namespace)::BitArg,(anonymous_namespace)::BitArg,(anonymous_namespace)::BitArg>
                (((this->super_Window).d)->e,0xff00,"JOYP",args,args_1,args_2,args_3,args_4,args_5,
                 args_6,args_7);
      anon_unknown.dwarf_ae217::TextReg<>(((this->super_Window).d)->e,0xff01,"SB");
      anon_unknown.dwarf_ae217::TextReg<>(((this->super_Window).d)->e,0xff02,"SC");
      anon_unknown.dwarf_ae217::TextReg<>(((this->super_Window).d)->e,0xff04,"DIV");
      anon_unknown.dwarf_ae217::TextReg<>(((this->super_Window).d)->e,0xff05,"TIMA");
      anon_unknown.dwarf_ae217::TextReg<>(((this->super_Window).d)->e,0xff06,"TMA");
      pEVar1 = ((this->super_Window).d)->e;
      local_618._0_4_ = 1.0;
      local_618._4_4_ = 0.75;
      uStack_610._0_4_ = 0.3;
      uStack_610._4_4_ = 1.0;
      snprintf(buf,10,"[%s]","TAC");
      bVar4 = emulator_read_u8_raw(pEVar1,0xff07);
      ImGui::Text("0x%04X%8s:",0xff07,buf);
      ImGui::SameLine(0.0,-1.0);
      ImGui::TextColored((ImVec4 *)local_618,"%02X ",(ulong)bVar4);
      pcVar8 = "on";
      if ((bVar4 & 4) == 0) {
        pcVar8 = "off";
      }
      if (*pcVar8 != '\0') {
        ImGui::SameLine(0.0,-1.0);
        ImGui::Text("%s",pcVar8);
      }
      ImGui::SameLine(0.0,-1.0);
      ImGui::Text("%s ",&DAT_001c61b4 + *(int *)(&DAT_001c61b4 + (ulong)(bVar4 & 3) * 4));
      pEVar1 = ((this->super_Window).d)->e;
      local_618[0] = 1;
      uStack_610 = "VBLANK ";
      local_608 = "";
      pcStack_600 = (char *)0x0;
      local_5f8 = 0;
      buf[0] = '\x02';
      stack0xfffffffffffffb80 = "STAT ";
      local_458[0] = 4;
      uStack_450 = "TIMER ";
      local_448 = "";
      uStack_440 = 0;
      local_438 = 0;
      local_5f0 = '\b';
      pcStack_5e8 = "SERIAL ";
      local_5e0 = "";
      uStack_5d8 = 0;
      local_5d0 = 0;
      local_5c8 = 0x10;
      pcStack_5c0 = "JOYP ";
      local_5b8 = "";
      uStack_5b0 = 0;
      local_5a8 = 0;
      local_48.x = 1.0;
      local_48.y = 0.75;
      local_48.z = 0.3;
      local_48.w = 1.0;
      snprintf(local_52,10,"[%s]","IF");
      bVar4 = emulator_read_u8_raw(pEVar1,0xff0f);
      ImGui::Text("0x%04X%8s:",0xff0f,local_52);
      ImGui::SameLine(0.0,-1.0);
      uVar6 = 'I';
      ImGui::TextColored(&local_48,"%02X ",(ulong)bVar4);
      args_3_01._33_7_ = uStack_5f7;
      args_3_01.invert = (bool)local_5f8;
      args_3_01._4_4_ = local_618._4_4_;
      args_3_01._0_4_ = local_618._0_4_;
      args_2_01._4_1_ = buf[4];
      args_2_01._5_1_ = buf[5];
      args_2_01._6_1_ = buf[6];
      args_2_01._7_1_ = buf[7];
      args_2_01.mask = buf[0];
      args_2_01._1_1_ = buf[1];
      args_2_01._2_1_ = buf[2];
      args_2_01._3_1_ = buf[3];
      args_1_01._33_7_ = uStack_437;
      args_1_01.invert = (bool)local_438;
      args_1_01._4_4_ = local_458._4_4_;
      args_1_01._0_4_ = local_458._0_4_;
      args_01._33_7_ = uStack_5cf;
      args_01.invert = (bool)local_5d0;
      args_01._1_7_ = uStack_5ef;
      args_01.mask = local_5f0;
      arg._33_7_ = uStack_5a7;
      arg.invert = (bool)local_5a8;
      arg._1_7_ = uStack_5c7;
      arg.mask = local_5c8;
      arg.true_text = pcStack_5c0;
      arg.false_text = local_5b8;
      arg.tooltip = (char *)uStack_5b0;
      args_01.true_text = pcStack_5e8;
      args_01.false_text = local_5e0;
      args_01.tooltip = (char *)uStack_5d8;
      args_1_01.true_text = uStack_450;
      args_1_01.false_text = local_448;
      args_1_01.tooltip = (char *)uStack_440;
      args_2_01.true_text = stack0xfffffffffffffb80;
      args_2_01.false_text = "";
      args_2_01.tooltip = (char *)0x0;
      args_2_01._32_8_ = (ulong)uStack_467 << 8;
      args_3_01.true_text = uStack_610;
      args_3_01.false_text = local_608;
      args_3_01.tooltip._0_4_ = (int)pcStack_600;
      args_3_01.tooltip._4_4_ = (int)((ulong)pcStack_600 >> 0x20);
      (anonymous_namespace)::
      TextRegBits<(anonymous_namespace)::BitArg,(anonymous_namespace)::BitArg,(anonymous_namespace)::BitArg,(anonymous_namespace)::BitArg>
                ((Emulator *)(ulong)bVar4,uVar6,arg,args_01,args_1_01,args_2_01,args_3_01);
      local_1c0 = 0x80;
      pcStack_1b8 = "D ";
      local_1b0 = "__";
      pcStack_1a8 = "Display";
      local_1a0 = 0;
      local_1e8 = 0x40;
      pcStack_1e0 = "WM";
      local_1d8 = "__";
      pcStack_1d0 = "Window tile map select";
      local_1c8 = 0;
      local_210 = 0x20;
      pcStack_208 = "Wd";
      local_200 = "__";
      pcStack_1f8 = "Window display";
      local_1f0 = 0;
      local_238 = 0x10;
      pcStack_230 = "BD";
      local_228 = "__";
      pcStack_220 = "BG tile data select";
      local_218 = 0;
      local_260 = 8;
      pcStack_258 = "BM";
      local_250 = "__";
      pcStack_248 = "BG tile map select";
      local_240 = 0;
      local_288 = 4;
      pcStack_280 = "Os";
      local_278 = "__";
      pcStack_270 = "Obj size";
      local_268 = 0;
      local_2b0 = 2;
      pcStack_2a8 = "Od";
      local_2a0 = "__";
      pcStack_298 = "Obj display";
      local_290 = 0;
      local_2d8 = 1;
      pcStack_2d0 = "Bd";
      local_2c8 = "__";
      pcStack_2c0 = "BG display";
      local_2b8 = 0;
      args_7_00._1_7_ = uStack_2d7;
      args_7_00.mask = 1;
      args_6_00._1_7_ = uStack_2af;
      args_6_00.mask = 2;
      args_5_00._1_7_ = uStack_287;
      args_5_00.mask = 4;
      args_4_00._1_7_ = uStack_25f;
      args_4_00.mask = 8;
      args_3_00._1_7_ = uStack_237;
      args_3_00.mask = 0x10;
      args_2_00._1_7_ = uStack_20f;
      args_2_00.mask = 0x20;
      args_1_00._1_7_ = uStack_1e7;
      args_1_00.mask = 0x40;
      args_00._1_7_ = uStack_1bf;
      args_00.mask = 0x80;
      args_00.true_text = "D ";
      args_00.false_text = "__";
      args_00.tooltip = "Display";
      args_00._32_8_ = (ulong)uStack_19f << 8;
      args_1_00.true_text = "WM";
      args_1_00.false_text = "__";
      args_1_00.tooltip = "Window tile map select";
      args_1_00._32_8_ = (ulong)uStack_1c7 << 8;
      args_2_00.true_text = "Wd";
      args_2_00.false_text = "__";
      args_2_00.tooltip = "Window display";
      args_2_00._32_8_ = (ulong)uStack_1ef << 8;
      args_3_00.true_text = "BD";
      args_3_00.false_text = "__";
      args_3_00.tooltip = "BG tile data select";
      args_3_00._32_8_ = (ulong)uStack_217 << 8;
      args_4_00.true_text = "BM";
      args_4_00.false_text = "__";
      args_4_00.tooltip = "BG tile map select";
      args_4_00._32_8_ = (ulong)uStack_23f << 8;
      args_5_00.true_text = "Os";
      args_5_00.false_text = "__";
      args_5_00.tooltip = "Obj size";
      args_5_00._32_8_ = (ulong)uStack_267 << 8;
      args_6_00.true_text = "Od";
      args_6_00.false_text = "__";
      args_6_00.tooltip = "Obj display";
      args_6_00._32_8_ = (ulong)uStack_28f << 8;
      args_7_00.true_text = "Bd";
      args_7_00.false_text._0_4_ = 0x1c643b;
      args_7_00.false_text._4_4_ = 0;
      args_7_00.tooltip = "BG display";
      args_7_00._32_4_ = (int)uStack_2b7 << 8;
      args_7_00._36_4_ = (int)((uint7)uStack_2b7 >> 0x18);
      (anonymous_namespace)::
      TextReg<(anonymous_namespace)::BitArg,(anonymous_namespace)::BitArg,(anonymous_namespace)::BitArg,(anonymous_namespace)::BitArg,(anonymous_namespace)::BitArg,(anonymous_namespace)::BitArg,(anonymous_namespace)::BitArg,(anonymous_namespace)::BitArg>
                (((this->super_Window).d)->e,0xff40,"LCDC",args_00,args_1_00,args_2_00,args_3_00,
                 args_4_00,args_5_00,args_6_00,args_7_00);
      pEVar1 = ((this->super_Window).d)->e;
      local_618[0] = 4;
      uStack_610 = "Y=";
      local_608 = "__";
      pcStack_600 = "Y compare set";
      local_5f8 = 0;
      buf[0] = '\0';
      buf[1] = '\0';
      buf[2] = -0x80;
      buf[3] = '?';
      buf[4] = '\0';
      buf[5] = '\0';
      buf[6] = '@';
      buf[7] = '?';
      stack0xfffffffffffffb80 = 0.3;
      fStack_47c = 1.0;
      pcVar8 = "STAT";
      snprintf(local_458,10,"[%s]");
      bVar4 = emulator_read_u8_raw(pEVar1,0xff41);
      ImGui::Text("0x%04X%8s:",0xff41,local_458);
      ImGui::SameLine(0.0,-1.0);
      ImGui::TextColored((ImVec4 *)buf,"%02X ",(ulong)(uint)bVar4);
      pcVar9 = "Yi";
      if ((bVar4 & 0x40) == 0) {
        pcVar9 = "__";
      }
      if (*pcVar9 != '\0') {
        ImGui::SameLine(0.0,-1.0);
        ImGui::Text("%s",pcVar9);
        bVar3 = ImGui::IsItemHovered(0);
        if (bVar3) {
          ImGui::SetTooltip("Y compare interrupt");
        }
      }
      pcVar9 = "2i";
      if ((bVar4 & 0x20) == 0) {
        pcVar9 = "__";
      }
      if (*pcVar9 != '\0') {
        ImGui::SameLine(0.0,-1.0);
        ImGui::Text("%s",pcVar9);
        bVar3 = ImGui::IsItemHovered(0);
        if (bVar3) {
          ImGui::SetTooltip("Mode 2 interrupt");
        }
      }
      pcVar9 = "Vi";
      if ((bVar4 & 0x10) == 0) {
        pcVar9 = "__";
      }
      if (*pcVar9 != '\0') {
        ImGui::SameLine(0.0,-1.0);
        ImGui::Text("%s",pcVar9);
        bVar3 = ImGui::IsItemHovered(0);
        if (bVar3) {
          ImGui::SetTooltip("Vblank interrupt");
        }
      }
      pcVar9 = "Hi";
      if ((bVar4 & 8) == 0) {
        pcVar9 = "__";
      }
      if (*pcVar9 != '\0') {
        ImGui::SameLine(0.0,-1.0);
        ImGui::Text("%s",pcVar9);
        bVar3 = ImGui::IsItemHovered(0);
        if (bVar3) {
          ImGui::SetTooltip("Hblank interrupt");
        }
      }
      arg_03._33_7_ = uStack_5f7;
      arg_03.invert = (bool)local_5f8;
      arg_03._4_4_ = local_618._4_4_;
      arg_03._0_4_ = local_618._0_4_;
      arg_03.true_text = uStack_610;
      arg_03.false_text = local_608;
      arg_03.tooltip._0_4_ = (int)pcStack_600;
      arg_03.tooltip._4_4_ = (int)((ulong)pcStack_600 >> 0x20);
      args_07._8_8_ = pcVar8;
      args_07.text = (char *)0x3;
      anon_unknown.dwarf_ae217::TextRegBits<(anonymous_namespace)::IntArg>
                ((Emulator *)(ulong)(uint)bVar4,0xde,arg_03,args_07);
      anon_unknown.dwarf_ae217::TextReg<>(((this->super_Window).d)->e,0xff42,"SCY");
      anon_unknown.dwarf_ae217::TextReg<>(((this->super_Window).d)->e,0xff43,"SCX");
      anon_unknown.dwarf_ae217::TextReg<>(((this->super_Window).d)->e,0xff44,"LY");
      anon_unknown.dwarf_ae217::TextReg<>(((this->super_Window).d)->e,0xff45,"LYC");
      (anonymous_namespace)::
      TextReg<(anonymous_namespace)::DmgSwatchArg,(anonymous_namespace)::DmgSwatchArg,(anonymous_namespace)::DmgSwatchArg,(anonymous_namespace)::DmgSwatchArg>
                (((this->super_Window).d)->e,0xff47,"BGP",(DmgSwatchArg)0x0,
                 (DmgSwatchArg)0x100000000,(DmgSwatchArg)0x200000000,(DmgSwatchArg)0x300000000);
      local_5a0.palette_index = 1;
      local_5a0.color_index = 1;
      local_598.palette_index = 1;
      local_598.color_index = 2;
      local_590.palette_index = 1;
      local_590.color_index = 3;
      (anonymous_namespace)::
      TextReg<(anonymous_namespace)::DmgSwatchArg,(anonymous_namespace)::DmgSwatchArg,(anonymous_namespace)::DmgSwatchArg,(anonymous_namespace)::DmgSwatchArg>
                (((this->super_Window).d)->e,0xff48,"OPB0",(DmgSwatchArg)0x1,
                 (DmgSwatchArg)0x100000001,(DmgSwatchArg)0x200000001,(DmgSwatchArg)0x300000001);
      uVar7 = 0x200000002;
      (anonymous_namespace)::
      TextReg<(anonymous_namespace)::DmgSwatchArg,(anonymous_namespace)::DmgSwatchArg,(anonymous_namespace)::DmgSwatchArg,(anonymous_namespace)::DmgSwatchArg>
                (((this->super_Window).d)->e,0xff49,"OPB1",(DmgSwatchArg)0x2,
                 (DmgSwatchArg)0x100000002,(DmgSwatchArg)0x200000002,(DmgSwatchArg)0x300000002);
      anon_unknown.dwarf_ae217::TextReg<>(((this->super_Window).d)->e,0xff4a,"WY");
      anon_unknown.dwarf_ae217::TextReg<>(((this->super_Window).d)->e,0xff4b,"WX");
      pDVar5 = (this->super_Window).d;
      if (pDVar5->is_cgb == true) {
        pEVar1 = pDVar5->e;
        local_618[0] = 1;
        uStack_610 = "Sw";
        local_608 = "_";
        pcStack_600 = "Speed switch";
        local_5f8 = 0;
        buf[0] = -0x80;
        stack0xfffffffffffffb80 = "Sp";
        local_458._0_4_ = 1.0;
        local_458._4_4_ = 0.75;
        uStack_450._0_4_ = 0.3;
        uStack_450._4_4_ = 1.0;
        snprintf(&local_5f0,10,"[%s]","KEY1");
        bVar4 = emulator_read_u8_raw(pEVar1,0xff4d);
        ImGui::Text("0x%04X%8s:",0xff4d,&local_5f0);
        ImGui::SameLine(0.0,-1.0);
        uVar6 = 'I';
        ImGui::TextColored((ImVec4 *)local_458,"%02X ",(ulong)bVar4);
        args_05._4_4_ = local_618._4_4_;
        args_05._0_4_ = local_618._0_4_;
        arg_01._4_1_ = buf[4];
        arg_01._5_1_ = buf[5];
        arg_01._6_1_ = buf[6];
        arg_01._7_1_ = buf[7];
        arg_01.mask = buf[0];
        arg_01._1_1_ = buf[1];
        arg_01._2_1_ = buf[2];
        arg_01._3_1_ = buf[3];
        arg_01.true_text = stack0xfffffffffffffb80;
        arg_01.false_text = "_";
        arg_01.tooltip = "Current speed";
        arg_01._32_8_ = (ulong)uStack_467 << 8;
        args_05.true_text = uStack_610;
        args_05.false_text._0_4_ = (int)local_608;
        args_05.false_text._4_4_ = (int)((ulong)local_608 >> 0x20);
        args_05.tooltip = pcStack_600;
        args_05._32_4_ = (int)CONCAT71(uStack_5f7,local_5f8);
        args_05._36_4_ = (int)((uint7)uStack_5f7 >> 0x18);
        anon_unknown.dwarf_ae217::TextRegBits<(anonymous_namespace)::BitArg>
                  ((Emulator *)(ulong)bVar4,uVar6,arg_01,args_05);
        args_08.mask = (char)uVar7;
        args_08._9_3_ = (int3)((ulong)uVar7 >> 8);
        args_08.shift = (int)((ulong)uVar7 >> 0x20);
        args_08.text = (char *)0x1;
        anon_unknown.dwarf_ae217::TextReg<(anonymous_namespace)::IntArg>
                  ((anon_unknown_dwarf_ae217 *)((this->super_Window).d)->e,(Emulator *)0xff4f,0x21f2
                   ,"Bank",args_08);
        pEVar1 = ((this->super_Window).d)->e;
        local_618._0_4_ = 1.0;
        local_618._4_4_ = 0.75;
        uStack_610._0_4_ = 0.3;
        uStack_610._4_4_ = 1.0;
        snprintf(buf,10,"[%s]","HDMA5");
        bVar4 = emulator_read_u8_raw(pEVar1,0xff55);
        ImGui::Text("0x%04X%8s:",0xff55,buf);
        ImGui::SameLine(0.0,-1.0);
        ImGui::TextColored((ImVec4 *)local_618,"%02X ",(ulong)bVar4);
        ImGui::SameLine(0.0,-1.0);
        ImGui::Text("%s:%d ","Mode",(ulong)(bVar4 >> 7));
        ImGui::SameLine(0.0,-1.0);
        ImGui::Text("%s:%d ","Blocks",(ulong)(bVar4 & 0x7f));
        pEVar1 = ((this->super_Window).d)->e;
        local_618[0] = 1;
        uStack_610 = "W";
        local_608 = "_";
        pcStack_600 = "Write";
        local_5f8 = 0;
        buf[0] = '\x02';
        stack0xfffffffffffffb80 = "R";
        local_458._0_4_ = 1.0;
        local_458._4_4_ = 0.75;
        uStack_450._0_4_ = 0.3;
        uStack_450._4_4_ = 1.0;
        snprintf(&local_5f0,10,"[%s]","RP");
        bVar4 = emulator_read_u8_raw(pEVar1,0xff56);
        ImGui::Text("0x%04X%8s:",0xff56,&local_5f0);
        ImGui::SameLine(0.0,-1.0);
        ImGui::TextColored((ImVec4 *)local_458,"%02X ",(Emulator *)(ulong)bVar4);
        ImGui::SameLine(0.0,-1.0);
        uVar6 = '\x1a';
        ImGui::Text("%s:%d ","Enable",(ulong)(bVar4 >> 6));
        args_06._4_4_ = local_618._4_4_;
        args_06._0_4_ = local_618._0_4_;
        arg_02._4_1_ = buf[4];
        arg_02._5_1_ = buf[5];
        arg_02._6_1_ = buf[6];
        arg_02._7_1_ = buf[7];
        arg_02.mask = buf[0];
        arg_02._1_1_ = buf[1];
        arg_02._2_1_ = buf[2];
        arg_02._3_1_ = buf[3];
        arg_02.true_text = stack0xfffffffffffffb80;
        arg_02.false_text = "_";
        arg_02.tooltip = "Read";
        arg_02._32_8_ = (ulong)uStack_467 << 8;
        args_06.true_text = uStack_610;
        args_06.false_text._0_4_ = (int)local_608;
        args_06.false_text._4_4_ = (int)((ulong)local_608 >> 0x20);
        args_06.tooltip = pcStack_600;
        args_06._32_4_ = (int)CONCAT71(uStack_5f7,local_5f8);
        args_06._36_4_ = (int)((uint7)uStack_5f7 >> 0x18);
        anon_unknown.dwarf_ae217::TextRegBits<(anonymous_namespace)::BitArg>
                  ((Emulator *)(ulong)bVar4,uVar6,arg_02,args_06);
        local_300 = 0x80;
        pcStack_2f8 = "+";
        local_2f0 = "_";
        pcStack_2e8 = "Auto-increment";
        local_2e0 = 0;
        args_03._1_7_ = uStack_2ff;
        args_03.mask = 0x80;
        args_03.true_text = "+";
        args_03.false_text = "_";
        args_03.tooltip._0_4_ = 0x1c632c;
        args_03.tooltip._4_4_ = 0;
        args_03._32_8_ = (ulong)uStack_2df << 8;
        args_1_03.mask = '?';
        args_1_03._9_3_ = 0;
        args_1_03.shift = 0;
        args_1_03.text = "Index";
        (anonymous_namespace)::TextReg<(anonymous_namespace)::BitArg,(anonymous_namespace)::IntArg>
                  (((this->super_Window).d)->e,0xff68,"BCPS",args_03,args_1_03);
        anon_unknown.dwarf_ae217::TextReg<>(((this->super_Window).d)->e,0xff69,"BCPD");
        local_328 = 0x80;
        pcStack_320 = "+";
        local_318 = "_";
        pcStack_310 = "Auto-increment";
        local_308 = 0;
        args_04._1_7_ = uStack_327;
        args_04.mask = 0x80;
        args_04.true_text = "+";
        args_04.false_text = "_";
        args_04.tooltip._0_4_ = 0x1c632c;
        args_04.tooltip._4_4_ = 0;
        args_04._32_8_ = (ulong)uStack_307 << 8;
        args_1_04.mask = '?';
        args_1_04._9_3_ = 0;
        args_1_04.shift = 0;
        args_1_04.text = "Index";
        (anonymous_namespace)::TextReg<(anonymous_namespace)::BitArg,(anonymous_namespace)::IntArg>
                  (((this->super_Window).d)->e,0xff6a,"OCPS",args_04,args_1_04);
        anon_unknown.dwarf_ae217::TextReg<>(((this->super_Window).d)->e,0xff6b,"OCPD");
        args_09.mask = (char)uVar7;
        args_09._9_3_ = (int3)((ulong)uVar7 >> 8);
        args_09.shift = (int)((ulong)uVar7 >> 0x20);
        args_09.text = (char *)0x7;
        anon_unknown.dwarf_ae217::TextReg<(anonymous_namespace)::IntArg>
                  ((anon_unknown_dwarf_ae217 *)((this->super_Window).d)->e,(Emulator *)0xff70,0x21f1
                   ,"Bank",args_09);
        pDVar5 = (this->super_Window).d;
      }
      pEVar1 = pDVar5->e;
      local_618[0] = 1;
      uStack_610 = "VBLANK ";
      local_608 = "";
      pcStack_600 = (char *)0x0;
      local_5f8 = 0;
      buf[0] = '\x02';
      stack0xfffffffffffffb80 = "STAT ";
      local_458[0] = 4;
      uStack_450 = "TIMER ";
      local_448 = "";
      uStack_440 = 0;
      local_438 = 0;
      local_5f0 = '\b';
      pcStack_5e8 = "SERIAL ";
      local_5e0 = "";
      uStack_5d8 = 0;
      local_5d0 = 0;
      local_5c8 = 0x10;
      pcStack_5c0 = "JOYP ";
      local_5b8 = "";
      uStack_5b0 = 0;
      local_5a8 = 0;
      local_48.x = 1.0;
      local_48.y = 0.75;
      local_48.z = 0.3;
      local_48.w = 1.0;
      snprintf(local_52,10,"[%s]","IE");
      bVar4 = emulator_read_u8_raw(pEVar1,0xffff);
      ImGui::Text("0x%04X%8s:",0xffff,local_52);
      ImGui::SameLine(0.0,-1.0);
      uVar6 = 'I';
      ImGui::TextColored(&local_48,"%02X ",(ulong)bVar4);
      args_3_02._33_7_ = uStack_5f7;
      args_3_02.invert = (bool)local_5f8;
      args_3_02._4_4_ = local_618._4_4_;
      args_3_02._0_4_ = local_618._0_4_;
      args_2_02._4_1_ = buf[4];
      args_2_02._5_1_ = buf[5];
      args_2_02._6_1_ = buf[6];
      args_2_02._7_1_ = buf[7];
      args_2_02.mask = buf[0];
      args_2_02._1_1_ = buf[1];
      args_2_02._2_1_ = buf[2];
      args_2_02._3_1_ = buf[3];
      args_1_02._33_7_ = uStack_437;
      args_1_02.invert = (bool)local_438;
      args_1_02._4_4_ = local_458._4_4_;
      args_1_02._0_4_ = local_458._0_4_;
      args_02._33_7_ = uStack_5cf;
      args_02.invert = (bool)local_5d0;
      args_02._1_7_ = uStack_5ef;
      args_02.mask = local_5f0;
      arg_00._33_7_ = uStack_5a7;
      arg_00.invert = (bool)local_5a8;
      arg_00._1_7_ = uStack_5c7;
      arg_00.mask = local_5c8;
      arg_00.true_text = pcStack_5c0;
      arg_00.false_text = local_5b8;
      arg_00.tooltip = (char *)uStack_5b0;
      args_02.true_text = pcStack_5e8;
      args_02.false_text = local_5e0;
      args_02.tooltip = (char *)uStack_5d8;
      args_1_02.true_text = uStack_450;
      args_1_02.false_text = local_448;
      args_1_02.tooltip = (char *)uStack_440;
      args_2_02.true_text = stack0xfffffffffffffb80;
      args_2_02.false_text = "";
      args_2_02.tooltip = (char *)0x0;
      args_2_02._32_8_ = (ulong)uStack_467 << 8;
      args_3_02.true_text = uStack_610;
      args_3_02.false_text = local_608;
      args_3_02.tooltip._0_4_ = (int)pcStack_600;
      args_3_02.tooltip._4_4_ = (int)((ulong)pcStack_600 >> 0x20);
      (anonymous_namespace)::
      TextRegBits<(anonymous_namespace)::BitArg,(anonymous_namespace)::BitArg,(anonymous_namespace)::BitArg,(anonymous_namespace)::BitArg>
                ((Emulator *)(ulong)bVar4,uVar6,arg_00,args_02,args_1_02,args_2_02,args_3_02);
      pDVar5 = (this->super_Window).d;
      if (pDVar5->is_cgb == true) {
        ImGui::NewLine();
        local_498 = 0;
        local_490 = 2;
        local_338 = 0;
        local_330 = 3;
        (anonymous_namespace)::
        TextCgbPal<(anonymous_namespace)::CgbSwatchArg,(anonymous_namespace)::CgbSwatchArg,(anonymous_namespace)::CgbSwatchArg,(anonymous_namespace)::CgbSwatchArg>
                  (((this->super_Window).d)->e,"CGB BG Pal 0",(CgbSwatchArg)ZEXT812(0),
                   (CgbSwatchArg)(ZEXT412(1) << 0x40),(CgbSwatchArg)(ZEXT412(2) << 0x40),
                   (CgbSwatchArg)(ZEXT412(3) << 0x40));
        local_4a8 = 0x100000000;
        local_4a0 = 2;
        local_348 = 0x100000000;
        local_340 = 3;
        args_2_03.color_index = 2;
        args_2_03.type = CGB_PALETTE_TYPE_BGCP;
        args_2_03.palette_index = 1;
        args_3_03.color_index = 3;
        args_3_03.type = CGB_PALETTE_TYPE_BGCP;
        args_3_03.palette_index = 1;
        args_1_05.color_index = 1;
        args_1_05.type = CGB_PALETTE_TYPE_BGCP;
        args_1_05.palette_index = 1;
        (anonymous_namespace)::
        TextCgbPal<(anonymous_namespace)::CgbSwatchArg,(anonymous_namespace)::CgbSwatchArg,(anonymous_namespace)::CgbSwatchArg,(anonymous_namespace)::CgbSwatchArg>
                  (((this->super_Window).d)->e,"CGB BG Pal 1",(CgbSwatchArg)ZEXT812(0x100000000),
                   args_1_05,args_2_03,args_3_03);
        local_4b8 = 0x200000000;
        local_4b0 = 2;
        local_358 = 0x200000000;
        local_350 = 3;
        args_2_04.color_index = 2;
        args_2_04.type = CGB_PALETTE_TYPE_BGCP;
        args_2_04.palette_index = 2;
        args_3_04.color_index = 3;
        args_3_04.type = CGB_PALETTE_TYPE_BGCP;
        args_3_04.palette_index = 2;
        args_1_06.color_index = 1;
        args_1_06.type = CGB_PALETTE_TYPE_BGCP;
        args_1_06.palette_index = 2;
        (anonymous_namespace)::
        TextCgbPal<(anonymous_namespace)::CgbSwatchArg,(anonymous_namespace)::CgbSwatchArg,(anonymous_namespace)::CgbSwatchArg,(anonymous_namespace)::CgbSwatchArg>
                  (((this->super_Window).d)->e,"CGB BG Pal 2",(CgbSwatchArg)ZEXT812(0x200000000),
                   args_1_06,args_2_04,args_3_04);
        local_4c8 = 0x300000000;
        local_4c0 = 2;
        local_368 = 0x300000000;
        local_360 = 3;
        args_2_05.color_index = 2;
        args_2_05.type = CGB_PALETTE_TYPE_BGCP;
        args_2_05.palette_index = 3;
        args_3_05.color_index = 3;
        args_3_05.type = CGB_PALETTE_TYPE_BGCP;
        args_3_05.palette_index = 3;
        args_1_07.color_index = 1;
        args_1_07.type = CGB_PALETTE_TYPE_BGCP;
        args_1_07.palette_index = 3;
        (anonymous_namespace)::
        TextCgbPal<(anonymous_namespace)::CgbSwatchArg,(anonymous_namespace)::CgbSwatchArg,(anonymous_namespace)::CgbSwatchArg,(anonymous_namespace)::CgbSwatchArg>
                  (((this->super_Window).d)->e,"CGB BG Pal 3",(CgbSwatchArg)ZEXT812(0x300000000),
                   args_1_07,args_2_05,args_3_05);
        local_4d8 = 0x400000000;
        local_4d0 = 2;
        local_378 = 0x400000000;
        local_370 = 3;
        args_2_06.color_index = 2;
        args_2_06.type = CGB_PALETTE_TYPE_BGCP;
        args_2_06.palette_index = 4;
        args_3_06.color_index = 3;
        args_3_06.type = CGB_PALETTE_TYPE_BGCP;
        args_3_06.palette_index = 4;
        args_1_08.color_index = 1;
        args_1_08.type = CGB_PALETTE_TYPE_BGCP;
        args_1_08.palette_index = 4;
        (anonymous_namespace)::
        TextCgbPal<(anonymous_namespace)::CgbSwatchArg,(anonymous_namespace)::CgbSwatchArg,(anonymous_namespace)::CgbSwatchArg,(anonymous_namespace)::CgbSwatchArg>
                  (((this->super_Window).d)->e,"CGB BG Pal 4",(CgbSwatchArg)ZEXT812(0x400000000),
                   args_1_08,args_2_06,args_3_06);
        local_4e8 = 0x500000000;
        local_4e0 = 2;
        local_388 = 0x500000000;
        local_380 = 3;
        args_2_07.color_index = 2;
        args_2_07.type = CGB_PALETTE_TYPE_BGCP;
        args_2_07.palette_index = 5;
        args_3_07.color_index = 3;
        args_3_07.type = CGB_PALETTE_TYPE_BGCP;
        args_3_07.palette_index = 5;
        args_1_09.color_index = 1;
        args_1_09.type = CGB_PALETTE_TYPE_BGCP;
        args_1_09.palette_index = 5;
        (anonymous_namespace)::
        TextCgbPal<(anonymous_namespace)::CgbSwatchArg,(anonymous_namespace)::CgbSwatchArg,(anonymous_namespace)::CgbSwatchArg,(anonymous_namespace)::CgbSwatchArg>
                  (((this->super_Window).d)->e,"CGB BG Pal 5",(CgbSwatchArg)ZEXT812(0x500000000),
                   args_1_09,args_2_07,args_3_07);
        local_4f8 = 0x600000000;
        local_4f0 = 2;
        local_398 = 0x600000000;
        local_390 = 3;
        args_2_08.color_index = 2;
        args_2_08.type = CGB_PALETTE_TYPE_BGCP;
        args_2_08.palette_index = 6;
        args_3_08.color_index = 3;
        args_3_08.type = CGB_PALETTE_TYPE_BGCP;
        args_3_08.palette_index = 6;
        args_1_10.color_index = 1;
        args_1_10.type = CGB_PALETTE_TYPE_BGCP;
        args_1_10.palette_index = 6;
        (anonymous_namespace)::
        TextCgbPal<(anonymous_namespace)::CgbSwatchArg,(anonymous_namespace)::CgbSwatchArg,(anonymous_namespace)::CgbSwatchArg,(anonymous_namespace)::CgbSwatchArg>
                  (((this->super_Window).d)->e,"CGB BG Pal 6",(CgbSwatchArg)ZEXT812(0x600000000),
                   args_1_10,args_2_08,args_3_08);
        local_508 = 0x700000000;
        local_500 = 2;
        local_3a8 = 0x700000000;
        local_3a0 = 3;
        args_2_09.color_index = 2;
        args_2_09.type = CGB_PALETTE_TYPE_BGCP;
        args_2_09.palette_index = 7;
        args_3_09.color_index = 3;
        args_3_09.type = CGB_PALETTE_TYPE_BGCP;
        args_3_09.palette_index = 7;
        args_1_11.color_index = 1;
        args_1_11.type = CGB_PALETTE_TYPE_BGCP;
        args_1_11.palette_index = 7;
        (anonymous_namespace)::
        TextCgbPal<(anonymous_namespace)::CgbSwatchArg,(anonymous_namespace)::CgbSwatchArg,(anonymous_namespace)::CgbSwatchArg,(anonymous_namespace)::CgbSwatchArg>
                  (((this->super_Window).d)->e,"CGB BG Pal 7",(CgbSwatchArg)ZEXT812(0x700000000),
                   args_1_11,args_2_09,args_3_09);
        local_518 = 1;
        local_510 = 2;
        local_3b8 = 1;
        local_3b0 = 3;
        args_2_10.color_index = 2;
        args_2_10.type = CGB_PALETTE_TYPE_OBCP;
        args_2_10.palette_index = 0;
        args_3_10.color_index = 3;
        args_3_10.type = CGB_PALETTE_TYPE_OBCP;
        args_3_10.palette_index = 0;
        args_1_12.color_index = 1;
        args_1_12.type = CGB_PALETTE_TYPE_OBCP;
        args_1_12.palette_index = 0;
        (anonymous_namespace)::
        TextCgbPal<(anonymous_namespace)::CgbSwatchArg,(anonymous_namespace)::CgbSwatchArg,(anonymous_namespace)::CgbSwatchArg,(anonymous_namespace)::CgbSwatchArg>
                  (((this->super_Window).d)->e,"CGB OBJ Pal 0",(CgbSwatchArg)ZEXT812(1),args_1_12,
                   args_2_10,args_3_10);
        local_528 = local_5a0;
        local_520 = 2;
        local_3c8 = local_5a0;
        local_3c0 = 3;
        args_2_11.color_index = 2;
        args_2_11.type = local_5a0.palette_index;
        args_2_11.palette_index = local_5a0.color_index;
        args_3_11.color_index = 3;
        args_3_11.type = local_5a0.palette_index;
        args_3_11.palette_index = local_5a0.color_index;
        args_10.color_index = 0;
        args_10.type = local_5a0.palette_index;
        args_10.palette_index = local_5a0.color_index;
        args_1_13.color_index = 1;
        args_1_13.type = local_5a0.palette_index;
        args_1_13.palette_index = local_5a0.color_index;
        (anonymous_namespace)::
        TextCgbPal<(anonymous_namespace)::CgbSwatchArg,(anonymous_namespace)::CgbSwatchArg,(anonymous_namespace)::CgbSwatchArg,(anonymous_namespace)::CgbSwatchArg>
                  (((this->super_Window).d)->e,"CGB OBJ Pal 1",args_10,args_1_13,args_2_11,args_3_11
                  );
        local_538 = local_598;
        local_530 = 2;
        local_3d8 = local_598;
        local_3d0 = 3;
        args_2_12.color_index = 2;
        args_2_12.type = local_598.palette_index;
        args_2_12.palette_index = local_598.color_index;
        args_3_12.color_index = 3;
        args_3_12.type = local_598.palette_index;
        args_3_12.palette_index = local_598.color_index;
        args_11.color_index = 0;
        args_11.type = local_598.palette_index;
        args_11.palette_index = local_598.color_index;
        args_1_14.color_index = 1;
        args_1_14.type = local_598.palette_index;
        args_1_14.palette_index = local_598.color_index;
        (anonymous_namespace)::
        TextCgbPal<(anonymous_namespace)::CgbSwatchArg,(anonymous_namespace)::CgbSwatchArg,(anonymous_namespace)::CgbSwatchArg,(anonymous_namespace)::CgbSwatchArg>
                  (((this->super_Window).d)->e,"CGB OBJ Pal 2",args_11,args_1_14,args_2_12,args_3_12
                  );
        local_548 = local_590;
        local_540 = 2;
        local_3e8 = local_590;
        local_3e0 = 3;
        args_2_13.color_index = 2;
        args_2_13.type = local_590.palette_index;
        args_2_13.palette_index = local_590.color_index;
        args_3_13.color_index = 3;
        args_3_13.type = local_590.palette_index;
        args_3_13.palette_index = local_590.color_index;
        args_12.color_index = 0;
        args_12.type = local_590.palette_index;
        args_12.palette_index = local_590.color_index;
        args_1_15.color_index = 1;
        args_1_15.type = local_590.palette_index;
        args_1_15.palette_index = local_590.color_index;
        (anonymous_namespace)::
        TextCgbPal<(anonymous_namespace)::CgbSwatchArg,(anonymous_namespace)::CgbSwatchArg,(anonymous_namespace)::CgbSwatchArg,(anonymous_namespace)::CgbSwatchArg>
                  (((this->super_Window).d)->e,"CGB OBJ Pal 3",args_12,args_1_15,args_2_13,args_3_13
                  );
        local_558 = 0x400000001;
        local_550 = 2;
        local_3f8 = 0x400000001;
        local_3f0 = 3;
        args_2_14.color_index = 2;
        args_2_14.type = CGB_PALETTE_TYPE_OBCP;
        args_2_14.palette_index = 4;
        args_3_14.color_index = 3;
        args_3_14.type = CGB_PALETTE_TYPE_OBCP;
        args_3_14.palette_index = 4;
        args_1_16.color_index = 1;
        args_1_16.type = CGB_PALETTE_TYPE_OBCP;
        args_1_16.palette_index = 4;
        (anonymous_namespace)::
        TextCgbPal<(anonymous_namespace)::CgbSwatchArg,(anonymous_namespace)::CgbSwatchArg,(anonymous_namespace)::CgbSwatchArg,(anonymous_namespace)::CgbSwatchArg>
                  (((this->super_Window).d)->e,"CGB OBJ Pal 4",(CgbSwatchArg)ZEXT812(0x400000001),
                   args_1_16,args_2_14,args_3_14);
        local_568 = 0x500000001;
        local_560 = 2;
        local_408 = 0x500000001;
        local_400 = 3;
        args_2_15.color_index = 2;
        args_2_15.type = CGB_PALETTE_TYPE_OBCP;
        args_2_15.palette_index = 5;
        args_3_15.color_index = 3;
        args_3_15.type = CGB_PALETTE_TYPE_OBCP;
        args_3_15.palette_index = 5;
        args_1_17.color_index = 1;
        args_1_17.type = CGB_PALETTE_TYPE_OBCP;
        args_1_17.palette_index = 5;
        (anonymous_namespace)::
        TextCgbPal<(anonymous_namespace)::CgbSwatchArg,(anonymous_namespace)::CgbSwatchArg,(anonymous_namespace)::CgbSwatchArg,(anonymous_namespace)::CgbSwatchArg>
                  (((this->super_Window).d)->e,"CGB OBJ Pal 5",(CgbSwatchArg)ZEXT812(0x500000001),
                   args_1_17,args_2_15,args_3_15);
        local_578 = 0x600000001;
        local_570 = 2;
        local_418 = 0x600000001;
        local_410 = 3;
        args_2_16.color_index = 2;
        args_2_16.type = CGB_PALETTE_TYPE_OBCP;
        args_2_16.palette_index = 6;
        args_3_16.color_index = 3;
        args_3_16.type = CGB_PALETTE_TYPE_OBCP;
        args_3_16.palette_index = 6;
        args_1_18.color_index = 1;
        args_1_18.type = CGB_PALETTE_TYPE_OBCP;
        args_1_18.palette_index = 6;
        (anonymous_namespace)::
        TextCgbPal<(anonymous_namespace)::CgbSwatchArg,(anonymous_namespace)::CgbSwatchArg,(anonymous_namespace)::CgbSwatchArg,(anonymous_namespace)::CgbSwatchArg>
                  (((this->super_Window).d)->e,"CGB OBJ Pal 6",(CgbSwatchArg)ZEXT812(0x600000001),
                   args_1_18,args_2_16,args_3_16);
        local_588 = 0x700000001;
        local_580 = 2;
        local_428 = 0x700000001;
        local_420 = 3;
        args_2_17.color_index = 2;
        args_2_17.type = CGB_PALETTE_TYPE_OBCP;
        args_2_17.palette_index = 7;
        args_3_17.color_index = 3;
        args_3_17.type = CGB_PALETTE_TYPE_OBCP;
        args_3_17.palette_index = 7;
        args_1_19.color_index = 1;
        args_1_19.type = CGB_PALETTE_TYPE_OBCP;
        args_1_19.palette_index = 7;
        (anonymous_namespace)::
        TextCgbPal<(anonymous_namespace)::CgbSwatchArg,(anonymous_namespace)::CgbSwatchArg,(anonymous_namespace)::CgbSwatchArg,(anonymous_namespace)::CgbSwatchArg>
                  (((this->super_Window).d)->e,"CGB OBJ Pal 7",(CgbSwatchArg)ZEXT812(0x700000001),
                   args_1_19,args_2_17,args_3_17);
      }
      else if (pDVar5->is_sgb == true) {
        ImGui::NewLine();
        (anonymous_namespace)::
        TextSgbPal<(anonymous_namespace)::SgbSwatchArg,(anonymous_namespace)::SgbSwatchArg,(anonymous_namespace)::SgbSwatchArg,(anonymous_namespace)::SgbSwatchArg>
                  (((this->super_Window).d)->e,"SGB Pal 0",(SgbSwatchArg)0x0,
                   (SgbSwatchArg)0x100000000,(SgbSwatchArg)0x200000000,(SgbSwatchArg)0x300000000);
        (anonymous_namespace)::
        TextSgbPal<(anonymous_namespace)::SgbSwatchArg,(anonymous_namespace)::SgbSwatchArg,(anonymous_namespace)::SgbSwatchArg,(anonymous_namespace)::SgbSwatchArg>
                  (((this->super_Window).d)->e,"SGB Pal 1",(SgbSwatchArg)0x1,local_5a0,local_598,
                   local_590);
        (anonymous_namespace)::
        TextSgbPal<(anonymous_namespace)::SgbSwatchArg,(anonymous_namespace)::SgbSwatchArg,(anonymous_namespace)::SgbSwatchArg,(anonymous_namespace)::SgbSwatchArg>
                  (((this->super_Window).d)->e,"SGB Pal 2",(SgbSwatchArg)0x2,
                   (SgbSwatchArg)0x100000002,(SgbSwatchArg)0x200000002,(SgbSwatchArg)0x300000002);
        (anonymous_namespace)::
        TextSgbPal<(anonymous_namespace)::SgbSwatchArg,(anonymous_namespace)::SgbSwatchArg,(anonymous_namespace)::SgbSwatchArg,(anonymous_namespace)::SgbSwatchArg>
                  (((this->super_Window).d)->e,"SGB Pal 3",(SgbSwatchArg)0x3,
                   (SgbSwatchArg)0x100000003,(SgbSwatchArg)0x200000003,(SgbSwatchArg)0x300000003);
      }
    }
    ImGui::End();
  }
  return;
}

Assistant:

void Debugger::IOWindow::Tick() {
  if (!is_open) return;

  if (ImGui::Begin(Debugger::s_io_window_name, &is_open)) {
    u8 v;
    TextReg(d->e, 0xff00, "JOYP", InvBit(0x18, "D"), InvBit(0x14, "U"),
            InvBit(0x12, "L"), InvBit(0x11, "R"), InvBit(0x28, "+"),
            InvBit(0x24, "-"), InvBit(0x22, "B"), InvBit(0x21, "A"));

    TextReg(d->e, 0xff01, "SB");
    TextReg(d->e, 0xff02, "SC");
    TextReg(d->e, 0xff04, "DIV");
    TextReg(d->e, 0xff05, "TIMA");
    TextReg(d->e, 0xff06, "TMA");
    TextReg(d->e, 0xff07, "TAC", Bit(0x4, "on", "off"), Enum<TimerClock>(0x3));

    TextReg(d->e, 0xff0f, "IF", Bit0(0x10, "JOYP "), Bit0(0x8, "SERIAL "),
            Bit0(0x4, "TIMER "), Bit0(0x2, "STAT "), Bit0(0x1, "VBLANK "));

    TextReg(d->e, 0xff40, "LCDC", Bit2(0x80, "D ", "Display"),
            Bit2(0x40, "WM", "Window tile map select"),
            Bit2(0x20, "Wd", "Window display"),
            Bit2(0x10, "BD", "BG tile data select"),
            Bit2(0x08, "BM", "BG tile map select"),
            Bit2(0x04, "Os", "Obj size"), Bit2(0x02, "Od", "Obj display"),
            Bit2(0x01, "Bd", "BG display"));

    TextReg(d->e, 0xff41, "STAT", Bit2(0x40, "Yi", "Y compare interrupt"),
            Bit2(0x20, "2i", "Mode 2 interrupt"),
            Bit2(0x10, "Vi", "Vblank interrupt"),
            Bit2(0x08, "Hi", "Hblank interrupt"),
            Bit2(0x04, "Y=", "Y compare set"), Int("Mode", 0x03));

    TextReg(d->e, 0xff42, "SCY");
    TextReg(d->e, 0xff43, "SCX");
    TextReg(d->e, 0xff44, "LY");
    TextReg(d->e, 0xff45, "LYC");
    TextReg(d->e, 0xff47, "BGP", Swatch(PALETTE_TYPE_BGP, 0),
            Swatch(PALETTE_TYPE_BGP, 1), Swatch(PALETTE_TYPE_BGP, 2),
            Swatch(PALETTE_TYPE_BGP, 3));
    TextReg(d->e, 0xff48, "OPB0", Swatch(PALETTE_TYPE_OBP0, 0),
            Swatch(PALETTE_TYPE_OBP0, 1), Swatch(PALETTE_TYPE_OBP0, 2),
            Swatch(PALETTE_TYPE_OBP0, 3));
    TextReg(d->e, 0xff49, "OPB1", Swatch(PALETTE_TYPE_OBP1, 0),
            Swatch(PALETTE_TYPE_OBP1, 1), Swatch(PALETTE_TYPE_OBP1, 2),
            Swatch(PALETTE_TYPE_OBP1, 3));
    TextReg(d->e, 0xff4A, "WY");
    TextReg(d->e, 0xff4B, "WX");

    if (d->is_cgb) {
      TextReg(d->e, 0xff4d, "KEY1", Bit1(0x80, "Sp", "Current speed"),
              Bit1(0x1, "Sw", "Speed switch"));
      TextReg(d->e, 0xff4f, "VBK", Int("Bank", 0x1));
      TextReg(d->e, 0xff55, "HDMA5", Int("Mode", 0x80, 7), Int("Blocks", 0x7f));
      TextReg(d->e, 0xff56, "RP", Int("Enable", 0xc0, 6),
              Bit1(0x2, "R", "Read"), Bit1(0x01, "W", "Write"));

      TextReg(d->e, 0xff68, "BCPS", Bit1(0x80, "+", "Auto-increment"),
              Int("Index", 0x3f));
      TextReg(d->e, 0xff69, "BCPD");
      TextReg(d->e, 0xff6a, "OCPS", Bit1(0x80, "+", "Auto-increment"),
              Int("Index", 0x3f));
      TextReg(d->e, 0xff6b, "OCPD");
      TextReg(d->e, 0xff70, "SVBK", Int("Bank", 0x7));
    }

    TextReg(d->e, 0xffff, "IE", Bit0(0x10, "JOYP "), Bit0(0x8, "SERIAL "),
            Bit0(0x4, "TIMER "), Bit0(0x2, "STAT "), Bit0(0x1, "VBLANK "));

    if (d->is_cgb) {
      ImGui::NewLine();
      TextCgbPal(d->e, "CGB BG Pal 0", CgbSwatch(CGB_PALETTE_TYPE_BGCP, 0, 0),
                 CgbSwatch(CGB_PALETTE_TYPE_BGCP, 0, 1),
                 CgbSwatch(CGB_PALETTE_TYPE_BGCP, 0, 2),
                 CgbSwatch(CGB_PALETTE_TYPE_BGCP, 0, 3));
      TextCgbPal(d->e, "CGB BG Pal 1", CgbSwatch(CGB_PALETTE_TYPE_BGCP, 1, 0),
                 CgbSwatch(CGB_PALETTE_TYPE_BGCP, 1, 1),
                 CgbSwatch(CGB_PALETTE_TYPE_BGCP, 1, 2),
                 CgbSwatch(CGB_PALETTE_TYPE_BGCP, 1, 3));
      TextCgbPal(d->e, "CGB BG Pal 2", CgbSwatch(CGB_PALETTE_TYPE_BGCP, 2, 0),
                 CgbSwatch(CGB_PALETTE_TYPE_BGCP, 2, 1),
                 CgbSwatch(CGB_PALETTE_TYPE_BGCP, 2, 2),
                 CgbSwatch(CGB_PALETTE_TYPE_BGCP, 2, 3));
      TextCgbPal(d->e, "CGB BG Pal 3", CgbSwatch(CGB_PALETTE_TYPE_BGCP, 3, 0),
                 CgbSwatch(CGB_PALETTE_TYPE_BGCP, 3, 1),
                 CgbSwatch(CGB_PALETTE_TYPE_BGCP, 3, 2),
                 CgbSwatch(CGB_PALETTE_TYPE_BGCP, 3, 3));
      TextCgbPal(d->e, "CGB BG Pal 4", CgbSwatch(CGB_PALETTE_TYPE_BGCP, 4, 0),
                 CgbSwatch(CGB_PALETTE_TYPE_BGCP, 4, 1),
                 CgbSwatch(CGB_PALETTE_TYPE_BGCP, 4, 2),
                 CgbSwatch(CGB_PALETTE_TYPE_BGCP, 4, 3));
      TextCgbPal(d->e, "CGB BG Pal 5", CgbSwatch(CGB_PALETTE_TYPE_BGCP, 5, 0),
                 CgbSwatch(CGB_PALETTE_TYPE_BGCP, 5, 1),
                 CgbSwatch(CGB_PALETTE_TYPE_BGCP, 5, 2),
                 CgbSwatch(CGB_PALETTE_TYPE_BGCP, 5, 3));
      TextCgbPal(d->e, "CGB BG Pal 6", CgbSwatch(CGB_PALETTE_TYPE_BGCP, 6, 0),
                 CgbSwatch(CGB_PALETTE_TYPE_BGCP, 6, 1),
                 CgbSwatch(CGB_PALETTE_TYPE_BGCP, 6, 2),
                 CgbSwatch(CGB_PALETTE_TYPE_BGCP, 6, 3));
      TextCgbPal(d->e, "CGB BG Pal 7", CgbSwatch(CGB_PALETTE_TYPE_BGCP, 7, 0),
                 CgbSwatch(CGB_PALETTE_TYPE_BGCP, 7, 1),
                 CgbSwatch(CGB_PALETTE_TYPE_BGCP, 7, 2),
                 CgbSwatch(CGB_PALETTE_TYPE_BGCP, 7, 3));
      TextCgbPal(d->e, "CGB OBJ Pal 0", CgbSwatch(CGB_PALETTE_TYPE_OBCP, 0, 0),
                 CgbSwatch(CGB_PALETTE_TYPE_OBCP, 0, 1),
                 CgbSwatch(CGB_PALETTE_TYPE_OBCP, 0, 2),
                 CgbSwatch(CGB_PALETTE_TYPE_OBCP, 0, 3));
      TextCgbPal(d->e, "CGB OBJ Pal 1", CgbSwatch(CGB_PALETTE_TYPE_OBCP, 1, 0),
                 CgbSwatch(CGB_PALETTE_TYPE_OBCP, 1, 1),
                 CgbSwatch(CGB_PALETTE_TYPE_OBCP, 1, 2),
                 CgbSwatch(CGB_PALETTE_TYPE_OBCP, 1, 3));
      TextCgbPal(d->e, "CGB OBJ Pal 2", CgbSwatch(CGB_PALETTE_TYPE_OBCP, 2, 0),
                 CgbSwatch(CGB_PALETTE_TYPE_OBCP, 2, 1),
                 CgbSwatch(CGB_PALETTE_TYPE_OBCP, 2, 2),
                 CgbSwatch(CGB_PALETTE_TYPE_OBCP, 2, 3));
      TextCgbPal(d->e, "CGB OBJ Pal 3", CgbSwatch(CGB_PALETTE_TYPE_OBCP, 3, 0),
                 CgbSwatch(CGB_PALETTE_TYPE_OBCP, 3, 1),
                 CgbSwatch(CGB_PALETTE_TYPE_OBCP, 3, 2),
                 CgbSwatch(CGB_PALETTE_TYPE_OBCP, 3, 3));
      TextCgbPal(d->e, "CGB OBJ Pal 4", CgbSwatch(CGB_PALETTE_TYPE_OBCP, 4, 0),
                 CgbSwatch(CGB_PALETTE_TYPE_OBCP, 4, 1),
                 CgbSwatch(CGB_PALETTE_TYPE_OBCP, 4, 2),
                 CgbSwatch(CGB_PALETTE_TYPE_OBCP, 4, 3));
      TextCgbPal(d->e, "CGB OBJ Pal 5", CgbSwatch(CGB_PALETTE_TYPE_OBCP, 5, 0),
                 CgbSwatch(CGB_PALETTE_TYPE_OBCP, 5, 1),
                 CgbSwatch(CGB_PALETTE_TYPE_OBCP, 5, 2),
                 CgbSwatch(CGB_PALETTE_TYPE_OBCP, 5, 3));
      TextCgbPal(d->e, "CGB OBJ Pal 6", CgbSwatch(CGB_PALETTE_TYPE_OBCP, 6, 0),
                 CgbSwatch(CGB_PALETTE_TYPE_OBCP, 6, 1),
                 CgbSwatch(CGB_PALETTE_TYPE_OBCP, 6, 2),
                 CgbSwatch(CGB_PALETTE_TYPE_OBCP, 6, 3));
      TextCgbPal(d->e, "CGB OBJ Pal 7", CgbSwatch(CGB_PALETTE_TYPE_OBCP, 7, 0),
                 CgbSwatch(CGB_PALETTE_TYPE_OBCP, 7, 1),
                 CgbSwatch(CGB_PALETTE_TYPE_OBCP, 7, 2),
                 CgbSwatch(CGB_PALETTE_TYPE_OBCP, 7, 3));
    } else if (d->is_sgb) {
      ImGui::NewLine();
      TextSgbPal(d->e, "SGB Pal 0", SgbSwatch(0, 0), SgbSwatch(0, 1),
                 SgbSwatch(0, 2), SgbSwatch(0, 3));
      TextSgbPal(d->e, "SGB Pal 1", SgbSwatch(1, 0), SgbSwatch(1, 1),
                 SgbSwatch(1, 2), SgbSwatch(1, 3));
      TextSgbPal(d->e, "SGB Pal 2", SgbSwatch(2, 0), SgbSwatch(2, 1),
                 SgbSwatch(2, 2), SgbSwatch(2, 3));
      TextSgbPal(d->e, "SGB Pal 3", SgbSwatch(3, 0), SgbSwatch(3, 1),
                 SgbSwatch(3, 2), SgbSwatch(3, 3));
    }
  }
  ImGui::End();
}